

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vctsxs_ppc64(CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *b,uint32_t uim)

{
  bool bVar1;
  bool bVar2;
  float64 fVar3;
  int64_t iVar4;
  uint32_t uVar5;
  int64_t iVar6;
  long lVar7;
  float_status s;
  float_status local_38;
  
  local_38._2_6_ = SUB86(env->vec_status,2);
  local_38.float_detect_tininess = (env->vec_status).float_detect_tininess;
  local_38.float_rounding_mode = '\x03';
  lVar7 = 0;
  bVar1 = false;
  do {
    if ((b->f32[lVar7] & 0x7fffffff) < 0x7f800001) {
      fVar3 = float32_to_float64_ppc64(b->f32[lVar7],&local_38);
      fVar3 = float64_scalbn_ppc64(fVar3,uim,&local_38);
      iVar4 = float64_to_int64_ppc64(fVar3,&local_38);
      iVar6 = iVar4;
      if (0x7ffffffe < iVar4) {
        iVar6 = 0x7fffffff;
      }
      bVar2 = true;
      if ((int)iVar4 == iVar4) {
        bVar2 = bVar1;
      }
      bVar1 = bVar2;
      if (iVar6 < -0x7fffffff) {
        iVar6 = -0x80000000;
      }
      uVar5 = (uint32_t)iVar6;
    }
    else {
      uVar5 = 0;
    }
    r->u32[lVar7] = uVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (bVar1) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

target_ulong helper_vclzlsbb(ppc_avr_t *r)
{
    target_ulong count = 0;
    int i;
    for (i = 0; i < ARRAY_SIZE(r->u8); i++) {
        if (r->VsrB(i) & 0x01) {
            break;
        }
        count++;
    }
    return count;
}